

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbwrapper_tests.cpp
# Opt level: O3

void __thiscall dbwrapper_tests::iterator_ordering::test_method(iterator_ordering *this)

{
  long lVar1;
  bool bVar2;
  readonly_property<bool> rVar3;
  long lVar4;
  iterator in_R8;
  iterator pvVar5;
  iterator in_R9;
  iterator pvVar6;
  uint uVar7;
  uint x;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string file_07;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  check_type cVar8;
  char *local_350;
  char *local_348;
  undefined1 *local_340;
  undefined1 *local_338;
  char *local_330;
  char *local_328;
  undefined1 *local_320;
  undefined1 *local_318;
  char *local_310;
  char *local_308;
  undefined1 *local_300;
  undefined1 *local_2f8;
  char *local_2f0;
  char *local_2e8;
  char *local_2e0;
  char *local_2d8;
  undefined1 *local_2d0;
  undefined1 *local_2c8;
  char *local_2c0;
  char *local_2b8;
  uint local_2ac;
  undefined1 local_2a8 [16];
  undefined1 *local_298;
  char *local_290;
  undefined1 *local_288;
  undefined1 *local_280;
  char *local_278;
  char *local_270;
  char *local_268;
  char *local_260;
  undefined1 *local_258;
  undefined1 *local_250;
  char *local_248;
  char *local_240;
  char *local_238;
  char *local_230;
  undefined1 *local_228;
  undefined1 *local_220;
  char *local_218;
  char *local_210;
  uint32_t value_2;
  uint8_t key_2;
  uint local_1fc;
  char *local_1f8;
  char *local_1f0;
  undefined1 *local_1e8;
  undefined1 *local_1e0;
  char *local_1d8;
  char *local_1d0;
  unique_ptr<CDBIterator,_std::default_delete<CDBIterator>_> it;
  char *local_1c0;
  char *local_1b8;
  undefined1 *local_1b0;
  undefined1 *local_1a8;
  char *local_1a0;
  char *local_198;
  uint *local_190;
  assertion_result local_188;
  uint **local_170;
  uint32_t *local_168;
  uint8_t key;
  undefined7 uStack_15f;
  char *local_158;
  uint32_t value;
  element_type *local_148;
  shared_count sStack_140;
  undefined8 local_138;
  undefined1 local_130 [8];
  bool local_128;
  undefined1 *local_120 [3];
  size_t local_108;
  undefined4 local_100;
  CDBWrapper dbw;
  path local_88;
  path ph;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  ArgsManager::GetDataDir
            ((path *)&local_88,&(this->super_BOOST_AUTO_TEST_CASE_FIXTURE).m_args,false);
  std::filesystem::__cxx11::path::_M_append(&local_88,0x11,"iterator_ordering");
  std::filesystem::__cxx11::path::path(&ph.super_path,&local_88);
  std::filesystem::__cxx11::path::~path(&local_88);
  std::filesystem::__cxx11::path::path((path *)local_130,&ph.super_path);
  local_108 = 0x100000;
  local_100._0_1_ = true;
  local_100._1_1_ = false;
  local_100._2_1_ = false;
  local_100._3_1_ = false;
  CDBWrapper::CDBWrapper(&dbw,(DBParams *)local_130);
  std::filesystem::__cxx11::path::~path((path *)local_130);
  uVar7 = 0;
  do {
    _key = (char *)CONCAT71(uStack_15f,(char)uVar7);
    value = uVar7 * uVar7;
    if ((uVar7 & 1) == 0) {
      local_1a0 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/dbwrapper_tests.cpp"
      ;
      local_198 = "";
      local_1b0 = &boost::unit_test::basic_cstring<char_const>::null;
      local_1a8 = &boost::unit_test::basic_cstring<char_const>::null;
      file.m_end = (iterator)0x122;
      file.m_begin = (iterator)&local_1a0;
      msg.m_end = in_R9;
      msg.m_begin = in_R8;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_1b0,msg)
      ;
      _cVar8 = 0x37a45a;
      bVar2 = CDBWrapper::Write<unsigned_char,unsigned_int>(&dbw,&key,&value,false);
      local_188.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
           (readonly_property<bool>)(readonly_property<bool>)bVar2;
      local_188.m_message.px = (element_type *)0x0;
      local_188.m_message.pn.pi_ = (sp_counted_base *)0x0;
      local_2a8._0_8_ = "dbw.Write(key, value)";
      local_2a8._8_8_ = "";
      local_128 = false;
      local_130 = (undefined1  [8])&PTR__lazy_ostream_013ae1c8;
      local_120[0] = boost::unit_test::lazy_ostream::inst;
      local_120[1] = local_2a8;
      local_1c0 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/dbwrapper_tests.cpp"
      ;
      local_1b8 = "";
      in_R8 = (iterator)0x1;
      in_R9 = (iterator)0x0;
      boost::test_tools::tt_detail::report_assertion
                (&local_188,(lazy_ostream *)local_130,1,0,WARN,_cVar8,(size_t)&local_1c0,0x122);
      boost::detail::shared_count::~shared_count(&local_188.m_message.pn);
    }
    uVar7 = uVar7 + 1;
  } while (uVar7 != 0x100);
  it._M_t.super___uniq_ptr_impl<CDBIterator,_std::default_delete<CDBIterator>_>._M_t.
  super__Tuple_impl<0UL,_CDBIterator_*,_std::default_delete<CDBIterator>_>.
  super__Head_base<0UL,_CDBIterator_*,_false>._M_head_impl =
       (__uniq_ptr_data<CDBIterator,_std::default_delete<CDBIterator>,_true,_true>)
       CDBWrapper::NewIterator(&dbw);
  uVar7 = 0;
  do {
    _key = (char *)CONCAT71(uStack_15f,(char)uVar7);
    value = uVar7 * uVar7;
    if ((uVar7 & 1) != 0) {
      local_1d8 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/dbwrapper_tests.cpp"
      ;
      local_1d0 = "";
      local_1e8 = &boost::unit_test::basic_cstring<char_const>::null;
      local_1e0 = &boost::unit_test::basic_cstring<char_const>::null;
      file_00.m_end = (iterator)0x12b;
      file_00.m_begin = (iterator)&local_1d8;
      msg_00.m_end = in_R9;
      msg_00.m_begin = in_R8;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_1e8,
                 msg_00);
      _cVar8 = 0x37a5bb;
      bVar2 = CDBWrapper::Write<unsigned_char,unsigned_int>(&dbw,&key,&value,false);
      local_188.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
           (readonly_property<bool>)(readonly_property<bool>)bVar2;
      local_188.m_message.px = (element_type *)0x0;
      local_188.m_message.pn.pi_ = (sp_counted_base *)0x0;
      local_2a8._0_8_ = "dbw.Write(key, value)";
      local_2a8._8_8_ = "";
      local_128 = false;
      local_130 = (undefined1  [8])&PTR__lazy_ostream_013ae1c8;
      local_120[0] = boost::unit_test::lazy_ostream::inst;
      local_120[1] = local_2a8;
      local_1f8 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/dbwrapper_tests.cpp"
      ;
      local_1f0 = "";
      in_R8 = (iterator)0x1;
      in_R9 = (iterator)0x0;
      boost::test_tools::tt_detail::report_assertion
                (&local_188,(lazy_ostream *)local_130,1,0,WARN,_cVar8,(size_t)&local_1f8,299);
      boost::detail::shared_count::~shared_count(&local_188.m_message.pn);
    }
    uVar7 = uVar7 + 1;
  } while (uVar7 != 0x100);
  local_138 = 0x8000000000;
  lVar4 = 0;
  do {
    uVar7 = *(uint *)((long)&local_138 + lVar4);
    local_130[0] = (char)uVar7;
    CDBIterator::Seek<unsigned_char>
              ((CDBIterator *)
               it._M_t.super___uniq_ptr_impl<CDBIterator,_std::default_delete<CDBIterator>_>._M_t.
               super__Tuple_impl<0UL,_CDBIterator_*,_std::default_delete<CDBIterator>_>.
               super__Head_base<0UL,_CDBIterator_*,_false>._M_head_impl,local_130);
    for (local_1fc = uVar7; local_1fc < 0xff; local_1fc = local_1fc + 1) {
      local_218 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/dbwrapper_tests.cpp"
      ;
      local_210 = "";
      local_228 = &boost::unit_test::basic_cstring<char_const>::null;
      local_220 = &boost::unit_test::basic_cstring<char_const>::null;
      file_01.m_end = (iterator)0x133;
      file_01.m_begin = (iterator)&local_218;
      msg_01.m_end = in_R9;
      msg_01.m_begin = in_R8;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_228,
                 msg_01);
      _cVar8 = 0x37a726;
      bVar2 = CDBIterator::Valid((CDBIterator *)
                                 it._M_t.
                                 super___uniq_ptr_impl<CDBIterator,_std::default_delete<CDBIterator>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_CDBIterator_*,_std::default_delete<CDBIterator>_>
                                 .super__Head_base<0UL,_CDBIterator_*,_false>._M_head_impl);
      local_188.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
           (readonly_property<bool>)(readonly_property<bool>)bVar2;
      local_188.m_message.px = (element_type *)0x0;
      local_188.m_message.pn.pi_ = (sp_counted_base *)0x0;
      local_2a8._0_8_ = "it->Valid()";
      local_2a8._8_8_ = "";
      local_128 = false;
      local_130 = (undefined1  [8])&PTR__lazy_ostream_013ae1c8;
      local_120[0] = boost::unit_test::lazy_ostream::inst;
      local_120[1] = local_2a8;
      local_238 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/dbwrapper_tests.cpp"
      ;
      local_230 = "";
      in_R8 = (iterator)0x1;
      in_R9 = (iterator)0x0;
      boost::test_tools::tt_detail::report_assertion
                (&local_188,(lazy_ostream *)local_130,1,0,WARN,_cVar8,(size_t)&local_238,0x133);
      boost::detail::shared_count::~shared_count(&local_188.m_message.pn);
      bVar2 = CDBIterator::Valid((CDBIterator *)
                                 it._M_t.
                                 super___uniq_ptr_impl<CDBIterator,_std::default_delete<CDBIterator>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_CDBIterator_*,_std::default_delete<CDBIterator>_>
                                 .super__Head_base<0UL,_CDBIterator_*,_false>._M_head_impl);
      if (!bVar2) break;
      local_248 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/dbwrapper_tests.cpp"
      ;
      local_240 = "";
      local_258 = &boost::unit_test::basic_cstring<char_const>::null;
      local_250 = &boost::unit_test::basic_cstring<char_const>::null;
      file_02.m_end = (iterator)0x136;
      file_02.m_begin = (iterator)&local_248;
      msg_02.m_end = in_R9;
      msg_02.m_begin = in_R8;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_258,
                 msg_02);
      _cVar8 = 0x37a841;
      rVar3.super_class_property<bool>.value =
           (class_property<bool>)
           CDBIterator::GetKey<unsigned_char>
                     ((CDBIterator *)
                      it._M_t.super___uniq_ptr_impl<CDBIterator,_std::default_delete<CDBIterator>_>.
                      _M_t.super__Tuple_impl<0UL,_CDBIterator_*,_std::default_delete<CDBIterator>_>.
                      super__Head_base<0UL,_CDBIterator_*,_false>._M_head_impl,&key_2);
      local_188.m_message.px = (element_type *)0x0;
      local_188.m_message.pn.pi_ = (sp_counted_base *)0x0;
      local_2a8._0_8_ = "it->GetKey(key)";
      local_2a8._8_8_ = "";
      local_128 = false;
      local_130 = (undefined1  [8])&PTR__lazy_ostream_013ae1c8;
      local_120[0] = boost::unit_test::lazy_ostream::inst;
      local_120[1] = local_2a8;
      local_268 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/dbwrapper_tests.cpp"
      ;
      local_260 = "";
      pvVar5 = (iterator)0x1;
      pvVar6 = (iterator)0x0;
      local_188.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
           (readonly_property<bool>)(readonly_property<bool>)rVar3.super_class_property<bool>.value;
      boost::test_tools::tt_detail::report_assertion
                (&local_188,(lazy_ostream *)local_130,1,0,WARN,_cVar8,(size_t)&local_268,0x136);
      boost::detail::shared_count::~shared_count(&local_188.m_message.pn);
      if ((local_1fc & 1) == 0) {
        local_2c0 = 
        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/dbwrapper_tests.cpp"
        ;
        local_2b8 = "";
        local_2d0 = &boost::unit_test::basic_cstring<char_const>::null;
        local_2c8 = &boost::unit_test::basic_cstring<char_const>::null;
        file_03.m_end = (iterator)0x13b;
        file_03.m_begin = (iterator)&local_2c0;
        msg_03.m_end = pvVar6;
        msg_03.m_begin = pvVar5;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_2d0
                   ,msg_03);
        _cVar8 = 0x37a955;
        local_188.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
             (readonly_property<bool>)
             CDBIterator::GetValue<unsigned_int>
                       ((CDBIterator *)
                        it._M_t.
                        super___uniq_ptr_impl<CDBIterator,_std::default_delete<CDBIterator>_>._M_t.
                        super__Tuple_impl<0UL,_CDBIterator_*,_std::default_delete<CDBIterator>_>.
                        super__Head_base<0UL,_CDBIterator_*,_false>._M_head_impl,&value_2);
        local_188.m_message.px = (element_type *)0x0;
        local_188.m_message.pn.pi_ = (sp_counted_base *)0x0;
        local_2a8._0_8_ = "it->GetValue(value)";
        local_2a8._8_8_ = "";
        local_128 = false;
        local_130 = (undefined1  [8])&PTR__lazy_ostream_013ae1c8;
        local_120[0] = boost::unit_test::lazy_ostream::inst;
        local_120[1] = local_2a8;
        local_2e0 = 
        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/dbwrapper_tests.cpp"
        ;
        local_2d8 = "";
        pvVar5 = (iterator)0x1;
        pvVar6 = (iterator)0x0;
        boost::test_tools::tt_detail::report_assertion
                  (&local_188,(lazy_ostream *)local_130,1,0,WARN,_cVar8,(size_t)&local_2e0,0x13b);
        boost::detail::shared_count::~shared_count(&local_188.m_message.pn);
        local_2f0 = 
        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/dbwrapper_tests.cpp"
        ;
        local_2e8 = "";
        local_300 = &boost::unit_test::basic_cstring<char_const>::null;
        local_2f8 = &boost::unit_test::basic_cstring<char_const>::null;
        file_04.m_end = (iterator)0x13c;
        file_04.m_begin = (iterator)&local_2f0;
        msg_04.m_end = pvVar6;
        msg_04.m_begin = pvVar5;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_300
                   ,msg_04);
        local_2a8._8_8_ = local_2a8._8_8_ & 0xffffffffffffff00;
        local_2a8._0_8_ = &PTR__lazy_ostream_013ae088;
        local_298 = boost::unit_test::lazy_ostream::inst;
        local_290 = "";
        value = CONCAT31(value._1_3_,local_1fc == key_2);
        local_148 = (element_type *)0x0;
        sStack_140.pi_ = (sp_counted_base *)0x0;
        _key = 
        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/dbwrapper_tests.cpp"
        ;
        local_158 = "";
        local_168 = (uint32_t *)&key_2;
        local_128 = false;
        local_130 = (undefined1  [8])&PTR__lazy_ostream_013aee50;
        local_120[0] = boost::unit_test::lazy_ostream::inst;
        local_120[1] = (undefined1 *)&local_168;
        local_190 = &local_1fc;
        local_188.m_message.px =
             (element_type *)((ulong)local_188.m_message.px & 0xffffffffffffff00);
        local_188._0_8_ = &PTR__lazy_ostream_013ae108;
        local_188.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
        local_170 = &local_190;
        pvVar5 = (iterator)0x1;
        pvVar6 = (iterator)0x2;
        boost::test_tools::tt_detail::report_assertion
                  ((assertion_result *)&value,(lazy_ostream *)local_2a8,1,2,REQUIRE,0x1126e0d,
                   (size_t)&key,0x13c,local_130,"x",&local_188);
        boost::detail::shared_count::~shared_count(&sStack_140);
        local_310 = 
        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/dbwrapper_tests.cpp"
        ;
        local_308 = "";
        local_320 = &boost::unit_test::basic_cstring<char_const>::null;
        local_318 = &boost::unit_test::basic_cstring<char_const>::null;
        file_05.m_end = (iterator)0x13d;
        file_05.m_begin = (iterator)&local_310;
        msg_05.m_end = pvVar6;
        msg_05.m_begin = pvVar5;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_320
                   ,msg_05);
        local_2a8._8_8_ = local_2a8._8_8_ & 0xffffffffffffff00;
        local_2a8._0_8_ = &PTR__lazy_ostream_013ae088;
        local_298 = boost::unit_test::lazy_ostream::inst;
        local_290 = "";
        local_2ac = local_1fc * local_1fc;
        value = CONCAT31(value._1_3_,value_2 == local_2ac);
        local_148 = (element_type *)0x0;
        sStack_140.pi_ = (sp_counted_base *)0x0;
        _key = 
        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/dbwrapper_tests.cpp"
        ;
        local_158 = "";
        local_168 = &value_2;
        local_128 = false;
        local_130 = (undefined1  [8])&PTR__lazy_ostream_013ae108;
        local_120[0] = boost::unit_test::lazy_ostream::inst;
        local_120[1] = (undefined1 *)&local_168;
        local_190 = &local_2ac;
        local_188.m_message.px =
             (element_type *)((ulong)local_188.m_message.px & 0xffffffffffffff00);
        local_188._0_8_ = &PTR__lazy_ostream_013ae108;
        local_188.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
        local_170 = &local_190;
        in_R8 = (iterator)0x1;
        in_R9 = (iterator)0x2;
        boost::test_tools::tt_detail::report_assertion
                  ((assertion_result *)&value,(lazy_ostream *)local_2a8,1,2,REQUIRE,0xe529b5,
                   (size_t)&key,0x13d,local_130,"x*x",&local_188);
        boost::detail::shared_count::~shared_count(&sStack_140);
        CDBIterator::Next((CDBIterator *)
                          it._M_t.
                          super___uniq_ptr_impl<CDBIterator,_std::default_delete<CDBIterator>_>._M_t
                          .super__Tuple_impl<0UL,_CDBIterator_*,_std::default_delete<CDBIterator>_>.
                          super__Head_base<0UL,_CDBIterator_*,_false>._M_head_impl);
      }
      else {
        local_278 = 
        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/dbwrapper_tests.cpp"
        ;
        local_270 = "";
        local_288 = &boost::unit_test::basic_cstring<char_const>::null;
        local_280 = &boost::unit_test::basic_cstring<char_const>::null;
        file_06.m_end = (iterator)0x138;
        file_06.m_begin = (iterator)&local_278;
        msg_06.m_end = pvVar6;
        msg_06.m_begin = pvVar5;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_288
                   ,msg_06);
        local_2a8._8_8_ = local_2a8._8_8_ & 0xffffffffffffff00;
        local_2a8._0_8_ = &PTR__lazy_ostream_013ae088;
        local_298 = boost::unit_test::lazy_ostream::inst;
        local_290 = "";
        local_2ac = local_1fc + 1;
        value = CONCAT31(value._1_3_,local_2ac == key_2);
        local_148 = (element_type *)0x0;
        sStack_140.pi_ = (sp_counted_base *)0x0;
        _key = 
        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/dbwrapper_tests.cpp"
        ;
        local_158 = "";
        local_168 = (uint32_t *)&key_2;
        local_128 = false;
        local_130 = (undefined1  [8])&PTR__lazy_ostream_013aee50;
        local_120[0] = boost::unit_test::lazy_ostream::inst;
        local_120[1] = (undefined1 *)&local_168;
        local_190 = &local_2ac;
        local_188.m_message.px =
             (element_type *)((ulong)local_188.m_message.px & 0xffffffffffffff00);
        local_188._0_8_ = &PTR__lazy_ostream_013ae108;
        local_188.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
        local_170 = &local_190;
        in_R8 = (iterator)0x1;
        in_R9 = (iterator)0x2;
        boost::test_tools::tt_detail::report_assertion
                  ((assertion_result *)&value,(lazy_ostream *)local_2a8,1,2,REQUIRE,0x1126e0d,
                   (size_t)&key,0x138,local_130,"x + 1",&local_188);
        boost::detail::shared_count::~shared_count(&sStack_140);
      }
    }
    local_330 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/dbwrapper_tests.cpp"
    ;
    local_328 = "";
    local_340 = &boost::unit_test::basic_cstring<char_const>::null;
    local_338 = &boost::unit_test::basic_cstring<char_const>::null;
    file_07.m_end = (iterator)0x140;
    file_07.m_begin = (iterator)&local_330;
    msg_07.m_end = in_R9;
    msg_07.m_begin = in_R8;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_340,
               msg_07);
    _cVar8 = 0x37aefa;
    bVar2 = CDBIterator::Valid((CDBIterator *)
                               it._M_t.
                               super___uniq_ptr_impl<CDBIterator,_std::default_delete<CDBIterator>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_CDBIterator_*,_std::default_delete<CDBIterator>_>
                               .super__Head_base<0UL,_CDBIterator_*,_false>._M_head_impl);
    local_188.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(readonly_property<bool>)!bVar2;
    local_188.m_message.px = (element_type *)0x0;
    local_188.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_2a8._0_8_ = "!it->Valid()";
    local_2a8._8_8_ = "";
    local_128 = false;
    local_130 = (undefined1  [8])&PTR__lazy_ostream_013ae1c8;
    local_120[0] = boost::unit_test::lazy_ostream::inst;
    local_120[1] = local_2a8;
    local_350 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/dbwrapper_tests.cpp"
    ;
    local_348 = "";
    in_R8 = (iterator)0x1;
    in_R9 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              (&local_188,(lazy_ostream *)local_130,1,0,WARN,_cVar8,(size_t)&local_350,0x140);
    boost::detail::shared_count::~shared_count(&local_188.m_message.pn);
    lVar4 = lVar4 + 4;
    if (lVar4 == 8) {
      std::unique_ptr<CDBIterator,_std::default_delete<CDBIterator>_>::~unique_ptr(&it);
      CDBWrapper::~CDBWrapper(&dbw);
      std::filesystem::__cxx11::path::~path(&ph.super_path);
      if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
        __stack_chk_fail();
      }
      return;
    }
  } while( true );
}

Assistant:

BOOST_AUTO_TEST_CASE(iterator_ordering)
{
    fs::path ph = m_args.GetDataDirBase() / "iterator_ordering";
    CDBWrapper dbw({.path = ph, .cache_bytes = 1 << 20, .memory_only = true, .wipe_data = false, .obfuscate = false});
    for (int x=0x00; x<256; ++x) {
        uint8_t key = x;
        uint32_t value = x*x;
        if (!(x & 1)) BOOST_CHECK(dbw.Write(key, value));
    }

    // Check that creating an iterator creates a snapshot
    std::unique_ptr<CDBIterator> it(const_cast<CDBWrapper&>(dbw).NewIterator());

    for (unsigned int x=0x00; x<256; ++x) {
        uint8_t key = x;
        uint32_t value = x*x;
        if (x & 1) BOOST_CHECK(dbw.Write(key, value));
    }

    for (const int seek_start : {0x00, 0x80}) {
        it->Seek((uint8_t)seek_start);
        for (unsigned int x=seek_start; x<255; ++x) {
            uint8_t key;
            uint32_t value;
            BOOST_CHECK(it->Valid());
            if (!it->Valid()) // Avoid spurious errors about invalid iterator's key and value in case of failure
                break;
            BOOST_CHECK(it->GetKey(key));
            if (x & 1) {
                BOOST_CHECK_EQUAL(key, x + 1);
                continue;
            }
            BOOST_CHECK(it->GetValue(value));
            BOOST_CHECK_EQUAL(key, x);
            BOOST_CHECK_EQUAL(value, x*x);
            it->Next();
        }
        BOOST_CHECK(!it->Valid());
    }
}